

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_xc_vv10.c
# Opt level: O1

void lc_set_ext_params(xc_func_type *p,double *ext_params)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double par;
  
  dVar1 = get_ext_param(p,ext_params,0);
  dVar2 = get_ext_param(p,ext_params,1);
  get_ext_param(p,ext_params,2);
  dVar3 = get_ext_param(p,ext_params,3);
  par = get_ext_param(p,ext_params,4);
  *p->mix_coef = -dVar3;
  xc_func_set_ext_params_name(*p->func_aux,"_omega",par);
  set_ext_params_cam(p,ext_params);
  p->nlc_b = dVar1;
  p->nlc_C = dVar2;
  return;
}

Assistant:

static void
lc_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double alpha, beta, omega, b, C;

  assert(p != NULL);

  b     = get_ext_param(p, ext_params, 0);
  C     = get_ext_param(p, ext_params, 1);
  alpha = get_ext_param(p, ext_params, 2);
  beta  = get_ext_param(p, ext_params, 3);
  omega = get_ext_param(p, ext_params, 4);

  /* DFT part */
  p->mix_coef[0] = -beta;
  xc_func_set_ext_params_name(p->func_aux[0], "_omega", omega);

  /* Set the hybrid flags */
  set_ext_params_cam(p, ext_params);

  /* Non-local correlation part */
  p->nlc_b = b;
  p->nlc_C = C;
}